

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cRGBT,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  EBlend EVar2;
  FSpecialColormap *pFVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  BYTE BVar7;
  byte *pbVar8;
  long lVar9;
  int iVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  
  pFVar3 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0063dd25_caseD_0:
    if (0 < count) {
      pbVar8 = pin + 2;
      lVar9 = 0;
      do {
        if (((pbVar8[-2] != tr) || (pbVar8[-1] != tg)) || (*pbVar8 != tb)) {
          iVar13 = (int)((uint)pbVar8[-2] * inf->alpha + (uint)pout[lVar9 * 4 + 2] * 0x10000) >>
                   0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar9 * 4 + 2] = (BYTE)iVar13;
          iVar13 = (int)((uint)pbVar8[-1] * inf->alpha + (uint)pout[lVar9 * 4 + 1] * 0x10000) >>
                   0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar9 * 4 + 1] = (BYTE)iVar13;
          iVar13 = (int)((uint)*pbVar8 * inf->alpha + (uint)pout[lVar9 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar9 * 4] = (BYTE)iVar13;
          pout[lVar9 * 4 + 3] = 0xff;
        }
        lVar9 = lVar9 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar9);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0063dd25_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pbVar8 = pin + 2;
        lVar9 = 0;
        do {
          bVar11 = pbVar8[-1];
          if ((pbVar8[-1] != tg || pbVar8[-2] != tr) || (bVar11 = tg, *pbVar8 != tb)) {
            uVar12 = (uint)bVar11 * 0x8f + (uint)pbVar8[-2] * 0x4d +
                     ((uint)*pbVar8 + (uint)*pbVar8 * 8) * 4 >> 0xc;
            iVar13 = (uint)IcePalette[uVar12][0] * inf->alpha + (uint)pout[lVar9 * 4 + 2] * 0x10000;
            BVar7 = (BYTE)((uint)iVar13 >> 0x10);
            if (0xfe < iVar13 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar9 * 4 + 2] = BVar7;
            iVar13 = (uint)IcePalette[uVar12][1] * inf->alpha + (uint)pout[lVar9 * 4 + 1] * 0x10000;
            BVar7 = (BYTE)((uint)iVar13 >> 0x10);
            if (0xfe < iVar13 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar9 * 4 + 1] = BVar7;
            iVar13 = (uint)IcePalette[uVar12][2] * inf->alpha + (uint)pout[lVar9 * 4] * 0x10000;
            BVar7 = (BYTE)((uint)iVar13 >> 0x10);
            if (0xfe < iVar13 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar9 * 4] = BVar7;
            pout[lVar9 * 4 + 3] = 0xff;
          }
          lVar9 = lVar9 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar9);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pbVar8 = pin + 2;
        lVar9 = 0;
        do {
          bVar11 = pbVar8[-1];
          if ((pbVar8[-1] != tg || pbVar8[-2] != tr) || (bVar11 = tg, *pbVar8 != tb)) {
            iVar13 = inf->blendcolor[3];
            iVar5 = inf->blendcolor[1];
            bVar4 = *pbVar8;
            iVar10 = inf->blendcolor[2];
            iVar14 = ((uint)pbVar8[-2] * iVar13 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                     (uint)pout[lVar9 * 4 + 2] * 0x10000;
            BVar7 = (BYTE)((uint)iVar14 >> 0x10);
            if (0xfe < iVar14 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar9 * 4 + 2] = BVar7;
            iVar5 = ((uint)bVar11 * iVar13 + iVar5 >> 0x10 & 0xff) * inf->alpha +
                    (uint)pout[lVar9 * 4 + 1] * 0x10000;
            BVar7 = (BYTE)((uint)iVar5 >> 0x10);
            if (0xfe < iVar5 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar9 * 4 + 1] = BVar7;
            iVar13 = ((uint)bVar4 * iVar13 + iVar10 >> 0x10 & 0xff) * inf->alpha +
                     (uint)pout[lVar9 * 4] * 0x10000;
            BVar7 = (BYTE)((uint)iVar13 >> 0x10);
            if (0xfe < iVar13 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar9 * 4] = BVar7;
            pout[lVar9 * 4 + 3] = 0xff;
          }
          lVar9 = lVar9 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar9);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pbVar8 = pin + 2;
        lVar9 = 0;
        do {
          bVar11 = pbVar8[-1];
          if ((pbVar8[-1] != tg || pbVar8[-2] != tr) || (bVar11 = tg, *pbVar8 != tb)) {
            iVar13 = (int)(((uint)pbVar8[-2] * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                          (uint)pout[lVar9 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            iVar5 = inf->blendcolor[1];
            bVar4 = *pbVar8;
            iVar10 = inf->blendcolor[2];
            pout[lVar9 * 4 + 2] = (BYTE)iVar13;
            iVar13 = (int)(((uint)bVar11 * iVar5 >> 0x10 & 0xff) * inf->alpha +
                          (uint)pout[lVar9 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            pout[lVar9 * 4 + 1] = (BYTE)iVar13;
            iVar13 = (int)(((uint)bVar4 * iVar10 >> 0x10 & 0xff) * inf->alpha +
                          (uint)pout[lVar9 * 4] * 0x10000) >> 0x10;
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            pout[lVar9 * 4] = (BYTE)iVar13;
            pout[lVar9 * 4 + 3] = 0xff;
          }
          lVar9 = lVar9 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar9);
      }
      break;
    default:
      EVar2 = inf->blend;
      lVar9 = (long)EVar2;
      if (lVar9 < 0x21) {
        if ((BLEND_ICEMAP < EVar2) && (0 < count)) {
          iVar13 = 0x20 - EVar2;
          pbVar8 = pin + 2;
          lVar9 = 0;
          do {
            bVar11 = pbVar8[-2];
            bVar4 = pbVar8[-1];
            if ((pbVar8[-1] != tg || bVar11 != tr) || (bVar4 = tg, *pbVar8 != tb)) {
              bVar1 = *pbVar8;
              iVar5 = ((uint)bVar4 * 0x8f + (uint)bVar11 * 0x4d +
                       ((uint)bVar1 + (uint)bVar1 * 8) * 4 >> 8) * (EVar2 + BLEND_MODULATE);
              iVar14 = (uint)bVar11 * iVar13 + iVar5;
              iVar10 = (uint)bVar4 * iVar13 + iVar5;
              iVar5 = (uint)bVar1 * iVar13 + iVar5;
              iVar14 = ((uint)((ulong)((long)iVar14 * 0x84210843) >> 0x24) - (iVar14 >> 0x1f) & 0xff
                       ) * inf->alpha + (uint)pout[lVar9 * 4 + 2] * 0x10000;
              BVar7 = (BYTE)((uint)iVar14 >> 0x10);
              if (0xfe < iVar14 >> 0x10) {
                BVar7 = 0xff;
              }
              pout[lVar9 * 4 + 2] = BVar7;
              iVar10 = ((uint)((ulong)((long)iVar10 * 0x84210843) >> 0x24) - (iVar10 >> 0x1f) & 0xff
                       ) * inf->alpha + (uint)pout[lVar9 * 4 + 1] * 0x10000;
              BVar7 = (BYTE)((uint)iVar10 >> 0x10);
              if (0xfe < iVar10 >> 0x10) {
                BVar7 = 0xff;
              }
              pout[lVar9 * 4 + 1] = BVar7;
              iVar5 = ((uint)((ulong)((long)iVar5 * 0x84210843) >> 0x24) - (iVar5 >> 0x1f) & 0xff) *
                      inf->alpha + (uint)pout[lVar9 * 4] * 0x10000;
              BVar7 = (BYTE)((uint)iVar5 >> 0x10);
              if (0xfe < iVar5 >> 0x10) {
                BVar7 = 0xff;
              }
              pout[lVar9 * 4] = BVar7;
              pout[lVar9 * 4 + 3] = 0xff;
            }
            lVar9 = lVar9 + 1;
            pbVar8 = pbVar8 + step;
          } while (count != (int)lVar9);
        }
      }
      else if (0 < count) {
        pbVar8 = pin + 2;
        lVar6 = 0;
        do {
          bVar11 = pbVar8[-1];
          if ((pbVar8[-1] != tg || pbVar8[-2] != tr) || (bVar11 = tg, *pbVar8 != tb)) {
            uVar15 = (ulong)((uint)bVar11 * 0x8f + (uint)pbVar8[-2] * 0x4d +
                             ((uint)*pbVar8 + (uint)*pbVar8 * 8) * 4 >> 8);
            bVar11 = *(byte *)((long)pFVar3 + uVar15 * 4 + lVar9 * 0x518 + -0xa700);
            bVar4 = *(byte *)((long)pFVar3 + uVar15 * 4 + lVar9 * 0x518 + -0xa6ff);
            iVar13 = (uint)*(byte *)((long)pFVar3 + uVar15 * 4 + lVar9 * 0x518 + -0xa6fe) *
                     inf->alpha + (uint)pout[lVar6 * 4 + 2] * 0x10000;
            BVar7 = (BYTE)((uint)iVar13 >> 0x10);
            if (0xfe < iVar13 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar6 * 4 + 2] = BVar7;
            iVar13 = (uint)bVar4 * inf->alpha + (uint)pout[lVar6 * 4 + 1] * 0x10000;
            BVar7 = (BYTE)((uint)iVar13 >> 0x10);
            if (0xfe < iVar13 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar6 * 4 + 1] = BVar7;
            iVar13 = (uint)bVar11 * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000;
            BVar7 = (BYTE)((uint)iVar13 >> 0x10);
            if (0xfe < iVar13 >> 0x10) {
              BVar7 = 0xff;
            }
            pout[lVar6 * 4] = BVar7;
            pout[lVar6 * 4 + 3] = 0xff;
          }
          lVar6 = lVar6 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar6);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}